

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::FBXImporter::CanRead(FBXImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  char *tokens [1];
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  BaseImporter::GetExtension(&local_70,pFile);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"fbx","");
  if (local_70._M_string_length == local_48) {
    if (local_70._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_70._M_dataplus._M_p,local_50,local_70._M_string_length);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  bVar1 = true;
  if (bVar3) goto LAB_005611c0;
  if (local_70._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_00561195;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_00561195:
    local_50 = (long *)0x6e55f1;
    bVar1 = BaseImporter::SearchFileHeaderForToken
                      (pIOHandler,pFile,(char **)&local_50,1,200,false,false);
    goto LAB_005611c0;
  }
  bVar1 = false;
LAB_005611c0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool FBXImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == std::string( desc.mFileExtensions ) ) {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        // at least ASCII-FBX files usually have a 'FBX' somewhere in their head
        const char* tokens[] = {"fbx"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}